

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

void __thiscall QPDFWriter::setExtraHeaderText(QPDFWriter *this,string *text)

{
  element_type *peVar1;
  size_type sVar2;
  string *psVar3;
  
  std::__cxx11::string::_M_assign
            ((string *)
             &((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->extra_header_text);
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  sVar2 = (peVar1->extra_header_text)._M_string_length;
  if ((sVar2 != 0) &&
     (psVar3 = &peVar1->extra_header_text, (psVar3->_M_dataplus)._M_p[sVar2 - 1] != '\n')) {
    std::__cxx11::string::append((char *)psVar3);
    return;
  }
  return;
}

Assistant:

void
QPDFWriter::setExtraHeaderText(std::string const& text)
{
    m->extra_header_text = text;
    if ((m->extra_header_text.length() > 0) && (*(m->extra_header_text.rbegin()) != '\n')) {
        QTC::TC("qpdf", "QPDFWriter extra header text add newline");
        m->extra_header_text += "\n";
    } else {
        QTC::TC("qpdf", "QPDFWriter extra header text no newline");
    }
}